

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

void xmlFreeStreamCtxt(xmlStreamCtxtPtr stream)

{
  _xmlStreamCtxt *p_Var1;
  xmlStreamCtxtPtr next;
  xmlStreamCtxtPtr stream_local;
  
  next = stream;
  while (next != (xmlStreamCtxtPtr)0x0) {
    p_Var1 = next->next;
    if (next->states != (int *)0x0) {
      (*xmlFree)(next->states);
    }
    (*xmlFree)(next);
    next = p_Var1;
  }
  return;
}

Assistant:

void
xmlFreeStreamCtxt(xmlStreamCtxtPtr stream) {
    xmlStreamCtxtPtr next;

    while (stream != NULL) {
        next = stream->next;
        if (stream->states != NULL)
	    xmlFree(stream->states);
        xmlFree(stream);
	stream = next;
    }
}